

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O1

unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> __thiscall
wabt::MakeUnique<wabt::FuncImport,std::__cxx11::string&>
          (wabt *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  string_view name;
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x158);
  name.data_ = (args->_M_dataplus)._M_p;
  name.size_ = args->_M_string_length;
  puVar1[1] = puVar1 + 3;
  puVar1[2] = 0;
  *(undefined1 *)(puVar1 + 3) = 0;
  puVar1[5] = puVar1 + 7;
  puVar1[6] = 0;
  *(undefined1 *)(puVar1 + 7) = 0;
  *(undefined4 *)(puVar1 + 9) = 0;
  *puVar1 = &PTR__FuncImport_001e6980;
  Func::Func((Func *)(puVar1 + 10),name);
  *(undefined8 **)this = puVar1;
  return (__uniq_ptr_data<wabt::FuncImport,_std::default_delete<wabt::FuncImport>,_true,_true>)
         (__uniq_ptr_data<wabt::FuncImport,_std::default_delete<wabt::FuncImport>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}